

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_store_fpr_D(DisasContext_conflict8 *dc,uint dst,TCGv_i32 v)

{
  TCGContext_conflict8 *pTVar1;
  TCGv_i32 pTVar2;
  uint arg2;
  uintptr_t o_1;
  
  pTVar1 = dc->uc->tcg_ctx;
  pTVar2 = *(TCGv_i32 *)((long)pTVar1->cpu_fpr + (ulong)(dst & 0x1e | (dst & 1) << 5) * 4);
  if (pTVar2 != v) {
    tcg_gen_op2_sparc64(pTVar1,INDEX_op_mov_i64,(TCGArg)(pTVar2 + (long)pTVar1),
                        (TCGArg)(v + (long)pTVar1));
  }
  arg2 = 2 - ((dst & 1) == 0);
  if ((dc->fprs_dirty & arg2) != 0) {
    return;
  }
  pTVar1 = dc->uc->tcg_ctx;
  dc->fprs_dirty = dc->fprs_dirty | arg2;
  pTVar2 = pTVar1->cpu_fprs;
  tcg_gen_ori_i32_sparc64(pTVar1,pTVar2,pTVar2,arg2);
  return;
}

Assistant:

static void gen_store_fpr_D(DisasContext *dc, unsigned int dst, TCGv_i64 v)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    dst = DFPREG(dst);
    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2], v);
    gen_update_fprs_dirty(dc, dst);
}